

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  ulong uVar1;
  void **table;
  xml_node_struct *pxVar2;
  xml_node_struct *key_00;
  xpath_node *pxVar3;
  xpath_allocator *in_RSI;
  int *in_RDI;
  void *key;
  void *node;
  void *attr;
  xpath_node *it;
  xpath_node *write;
  void **hash_data;
  size_t hash_size;
  size_t size_;
  xpath_allocator_capture cr;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  xpath_node *in_stack_ffffffffffffff50;
  xpath_node *in_stack_ffffffffffffff58;
  xml_node local_88;
  size_t in_stack_ffffffffffffff80;
  xml_attribute in_stack_ffffffffffffff88;
  xpath_node *local_68;
  undefined8 *local_60;
  ulong local_40;
  xpath_allocator_capture local_30;
  
  if ((*in_RDI == 0) && (2 < *(long *)(in_RDI + 4) - *(long *)(in_RDI + 2) >> 4)) {
    xpath_allocator_capture::xpath_allocator_capture(&local_30,in_RSI);
    uVar1 = *(long *)(in_RDI + 4) - *(long *)(in_RDI + 2) >> 4;
    for (local_40 = 1; local_40 < uVar1 + (uVar1 >> 1); local_40 = local_40 << 1) {
    }
    table = (void **)xpath_allocator::allocate
                               ((xpath_allocator *)in_stack_ffffffffffffff88._attr,
                                in_stack_ffffffffffffff80);
    if (table != (void **)0x0) {
      memset(table,0,local_40 << 3);
      local_60 = *(undefined8 **)(in_RDI + 2);
      for (local_68 = *(xpath_node **)(in_RDI + 2); local_68 != *(xpath_node **)(in_RDI + 4);
          local_68 = local_68 + 1) {
        xpath_node::attribute(local_68);
        pxVar2 = (xml_node_struct *)
                 xml_attribute::internal_object((xml_attribute *)&stack0xffffffffffffff88);
        local_88 = xpath_node::node((xpath_node *)
                                    CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        key_00 = xml_node::internal_object(&local_88);
        if (pxVar2 != (xml_node_struct *)0x0) {
          key_00 = pxVar2;
        }
        if ((key_00 != (xml_node_struct *)0x0) &&
           (in_stack_ffffffffffffff4f = hash_insert(table,local_40,key_00),
           (bool)in_stack_ffffffffffffff4f)) {
          *local_60 = (local_68->_node)._root;
          local_60[1] = (local_68->_attribute)._attr;
          local_60 = local_60 + 2;
        }
      }
      *(undefined8 **)(in_RDI + 4) = local_60;
    }
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x1fbcb8);
  }
  else {
    pxVar3 = (anonymous_namespace)::unique<pugi::xpath_node*>
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    *(xpath_node **)(in_RDI + 4) = pxVar3;
  }
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}